

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_future_release(green_future_t future)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  undefined8 uVar4;
  
  if (future == (green_future_t)0x0) {
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    fprintf(_stderr,"green_future_release(%p, %d)\n",future,(ulong)(uint)future->refs);
    if (future->refs < 1) {
      pcVar2 = "future->refs > 0";
      uVar4 = 0x246;
LAB_00101e6c:
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",pcVar2,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,uVar4);
      fflush(_stderr);
      abort();
    }
    iVar1 = future->refs + -1;
    future->refs = iVar1;
    if (iVar1 == 0) {
      if (future->poller != (green_poller_t)0x0) {
        pcVar2 = "future->poller == ((void*)0)";
        uVar4 = 0x248;
        goto LAB_00101e6c;
      }
      free(future);
    }
  }
  return iVar3;
}

Assistant:

int green_future_release(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    fprintf(stderr, "green_future_release(%p, %d)\n", future, future->refs);
    // NOTE: async operations hold an implicit ref count, so there is no risk
    //       of async operations dereferencing a dangling pointer when
    //       attempting to resolve the future.
    green_assert(future != NULL);
    green_assert(future->refs > 0);
    if (--future->refs == 0) {
        green_assert(future->poller == NULL);
        green_free(future);
    }
    return GREEN_SUCCESS;
}